

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int toconv;
  int len;
  xmlChar charref [20];
  char buf [50];
  int local_a0;
  uint local_9c;
  int local_98;
  uint local_94;
  xmlCharEncodingHandler *local_90;
  uchar local_88 [32];
  char local_68 [49];
  undefined1 local_37;
  
  iVar5 = -1;
  if (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0) {
    uVar4 = out->use;
    local_a0 = out->size - uVar4;
    local_a0 = local_a0 - (uint)(0 < local_a0);
    if (in != (xmlBufferPtr)0x0) {
      iVar5 = 0;
      local_90 = handler;
      do {
        local_9c = in->use;
        if (local_9c == 0) {
          return 0;
        }
        if (local_a0 <= (int)(local_9c * 4)) {
          xmlBufferGrow(out,local_9c * 4);
          local_a0 = ~out->use + out->size;
        }
        iVar3 = xmlEncOutputChunk(handler,out->content + out->use,&local_a0,in->content,
                                  (int *)&local_9c);
        xmlBufferShrink(in,local_9c);
        uVar4 = out->use + local_a0;
        out->use = uVar4;
        iVar5 = iVar5 + local_a0;
        out->content[uVar4] = '\0';
        if (iVar3 == -1) {
          if (local_a0 < 1) {
            iVar3 = -3;
            goto LAB_00145148;
          }
        }
        else {
LAB_00145148:
          if (iVar3 != -2) {
            if (iVar3 == -4) {
              __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                              (void *)0x0,(void *)0x0,0x1b,0x1774,XML_ERR_FATAL,(char *)0x0,0,
                              (char *)0x0,(char *)0x0,(char *)0x0,0,0,
                              "xmlCharEncOutFunc: no output function !\n",0);
              iVar3 = -1;
            }
LAB_001453a2:
            if (iVar5 == 0) {
              return iVar3;
            }
            return iVar5;
          }
          local_94 = in->use;
          uVar4 = xmlGetUTF8Char(in->content,(int *)&local_94);
          bVar2 = true;
          if ((int)uVar4 < 1) {
            iVar3 = -2;
          }
          else {
            local_98 = iVar5;
            uVar4 = snprintf((char *)local_88,0x14,"&#%d;",(ulong)uVar4);
            xmlBufferShrink(in,local_94);
            xmlBufferGrow(out,uVar4 * 4);
            local_a0 = ~out->use + out->size;
            local_9c = uVar4;
            iVar3 = xmlEncOutputChunk(handler,out->content + out->use,&local_a0,local_88,
                                      (int *)&local_9c);
            if ((iVar3 < 0) || (local_9c != uVar4)) {
              pbVar1 = in->content;
              snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar1,(ulong)pbVar1[1],
                       (ulong)pbVar1[2],(uint)pbVar1[3]);
              local_37 = 0;
              __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                              (void *)0x0,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,
                              local_68,(char *)0x0,(char *)0x0,0,0,
                              "output conversion failed due to conv error, bytes %s\n",local_68);
              handler = local_90;
              iVar5 = local_98;
              if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
                *in->content = ' ';
              }
            }
            else {
              uVar4 = out->use + local_a0;
              out->use = uVar4;
              out->content[uVar4] = '\0';
              bVar2 = false;
              handler = local_90;
              iVar5 = local_98 + local_a0;
            }
          }
          if (bVar2) goto LAB_001453a2;
        }
        uVar4 = out->use;
        local_a0 = out->size - uVar4;
        local_a0 = local_a0 - (uint)(0 < local_a0);
      } while (in != (xmlBufferPtr)0x0);
    }
    local_9c = 0;
    iVar5 = 0;
    xmlEncOutputChunk(handler,out->content + uVar4,&local_a0,(uchar *)0x0,(int *)&local_9c);
    uVar4 = out->use + local_a0;
    out->use = uVar4;
    out->content[uVar4] = '\0';
  }
  return iVar5;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv == 0)
	return(0);
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;
    if (ret == -1) {
        if (written > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            toconv, written);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            toconv, written, in->use);
#endif
	    break;
        case -4:
	    xmlEncodingErr(XML_I18N_NO_OUTPUT,
		           "xmlCharEncOutFunc: no output function !\n", NULL);
	    ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = in->use;
	    const xmlChar *utf = (const xmlChar *) in->content;
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(utf, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    in->content[0], in->content[1],
                    in->content[2], in->content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufferShrink(in, len);
            xmlBufferGrow(out, charrefLen * 4);
	    written = out->size - out->use - 1;
            toconv = charrefLen;
            ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                    charref, &toconv);

	    if ((ret < 0) || (toconv != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 in->content[0], in->content[1],
			 in->content[2], in->content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE)
		    in->content[0] = ' ';
	        break;
	    }

            out->use += written;
            writtentot += written;
            out->content[out->use] = 0;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}